

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  my_options_t *options;
  
  options = my_program_options_get(argc,argv);
  if (options->success == 0) {
    exit(1);
  }
  print_options(options);
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{

    my_options_t* options = my_program_options_get(argc, argv);
    if (options->success)
    {
        print_options(options);
        exit(EXIT_SUCCESS);
    }
    else
    {
        exit(EXIT_FAILURE);
    }
}